

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O3

ion_err_t ion_master_table_get_next_id(ion_dictionary_id_t *id)

{
  ion_dictionary_id_t iVar1;
  ion_err_t iVar2;
  ion_dictionary_config_info_t local_30;
  
  local_30.dictionary_size = 0;
  local_30.dictionary_type = dictionary_type_bpp_tree_t;
  local_30.dictionary_status = '\0';
  local_30._29_3_ = 0;
  local_30.use_type = '\0';
  local_30._5_3_ = 0;
  local_30.type = key_type_numeric_signed;
  local_30.key_size = 0;
  local_30.value_size = 0;
  local_30.id = ion_master_table_next_id + 1;
  iVar2 = ion_master_table_write(&local_30,0);
  if (iVar2 == '\0') {
    iVar1 = ion_master_table_next_id + 1;
    *id = ion_master_table_next_id;
    ion_master_table_next_id = iVar1;
  }
  return iVar2;
}

Assistant:

ion_err_t
ion_master_table_get_next_id(
	ion_dictionary_id_t *id
) {
	ion_err_t error								= err_ok;

	/* Flush master row. This writes the next ID to be used, so add 1. */
	ion_dictionary_config_info_t master_config	= { .id = ion_master_table_next_id + 1 };

	error = ion_master_table_write(&master_config, 0);

	if (err_ok != error) {
		return error;
	}

	*id = ion_master_table_next_id++;

	return err_ok;
}